

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int udp_check_url(nng_url *url,_Bool listen)

{
  char cVar1;
  int iVar2;
  
  cVar1 = *url->u_path;
  iVar2 = 0xf;
  if (((cVar1 == '\0') || ((cVar1 == '/' && (url->u_path[1] == '\0')))) &&
     ((url->u_fragment == (char *)0x0 &&
      (((url->u_userinfo == (char *)0x0 && (url->u_query == (char *)0x0)) &&
       ((listen || ((*url->u_hostname != '\0' && (url->u_port != 0)))))))))) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
udp_check_url(nng_url *url, bool listen)
{
	// Check for invalid URL components.
	if ((strlen(url->u_path) != 0) && (strcmp(url->u_path, "/") != 0)) {
		return (NNG_EADDRINVAL);
	}
	if ((url->u_fragment != NULL) || (url->u_userinfo != NULL) ||
	    (url->u_query != NULL)) {
		return (NNG_EADDRINVAL);
	}
	if (!listen) {
		if ((strlen(url->u_hostname) == 0) || (url->u_port == 0)) {
			return (NNG_EADDRINVAL);
		}
	}
	return (0);
}